

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

Box * amrex::FabArrayBase::CFinfo::Domain
                (Box *__return_storage_ptr__,Geometry *geom,IntVect *ng,bool include_periodic,
                bool include_physbndry)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar3 = *(undefined8 *)(geom->domain).smallend.vect;
  uVar4 = *(undefined8 *)((geom->domain).smallend.vect + 2);
  uVar5 = *(undefined8 *)((geom->domain).bigend.vect + 2);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(geom->domain).bigend.vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar5;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar3;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar4;
  lVar6 = 0;
  do {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar6 + 0x19) == '\x01') {
      if (include_periodic) {
LAB_004a468a:
        iVar2 = ng->vect[lVar6];
        piVar1 = (__return_storage_ptr__->smallend).vect + lVar6;
        *piVar1 = *piVar1 - iVar2;
        piVar1 = (__return_storage_ptr__->bigend).vect + lVar6;
        *piVar1 = *piVar1 + iVar2;
      }
    }
    else if (include_physbndry) goto LAB_004a468a;
    lVar6 = lVar6 + 1;
    if (lVar6 == 3) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Box
FabArrayBase::CFinfo::Domain (const Geometry& geom, const IntVect& ng,
                              bool include_periodic, bool include_physbndry)
{
    Box bx = geom.Domain();
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            if (include_periodic) {
                bx.grow(idim, ng[idim]);
            }
        } else {
            if (include_physbndry) {
                bx.grow(idim, ng[idim]);
            }
        }
    }
    return bx;
}